

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<IOVariable,_8UL>::reserve(SmallVector<IOVariable,_8UL> *this,size_t count)

{
  uint32_t uVar1;
  undefined7 uVar2;
  size_t sVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  IOVariable *pIVar6;
  IOVariable *pIVar7;
  IOVariable *local_58;
  ulong local_38;
  size_t i;
  IOVariable *new_buffer;
  unsigned_long local_20;
  size_t target_capacity;
  size_t count_local;
  SmallVector<IOVariable,_8UL> *this_local;
  
  target_capacity = count;
  count_local = (size_t)this;
  uVar4 = ::std::numeric_limits<unsigned_long>::max();
  sVar3 = target_capacity;
  if ((uVar4 / 0x18 < count) ||
     (uVar4 = ::std::numeric_limits<unsigned_long>::max(), uVar4 >> 1 < sVar3)) {
    ::std::terminate();
  }
  if (this->buffer_capacity < target_capacity) {
    local_20 = this->buffer_capacity;
    if (local_20 == 0) {
      local_20 = 1;
    }
    new_buffer = (IOVariable *)0x8;
    puVar5 = ::std::max<unsigned_long>(&local_20,(unsigned_long *)&new_buffer);
    for (local_20 = *puVar5; local_20 < target_capacity; local_20 = local_20 << 1) {
    }
    if (local_20 < 9) {
      local_58 = AlignedBuffer<IOVariable,_8UL>::data(&this->stack_storage);
    }
    else {
      local_58 = (IOVariable *)malloc(local_20 * 0x18);
    }
    if (local_58 == (IOVariable *)0x0) {
      ::std::terminate();
    }
    if (local_58 != (this->super_VectorView<IOVariable>).ptr) {
      for (local_38 = 0; local_38 < (this->super_VectorView<IOVariable>).buffer_size;
          local_38 = local_38 + 1) {
        pIVar6 = local_58 + local_38;
        pIVar7 = (this->super_VectorView<IOVariable>).ptr + local_38;
        pIVar6->var = pIVar7->var;
        uVar1 = pIVar7->block_member_index;
        pIVar6->location = pIVar7->location;
        pIVar6->block_member_index = uVar1;
        uVar2 = *(undefined7 *)&pIVar7->field_0x11;
        pIVar6->block = pIVar7->block;
        *(undefined7 *)&pIVar6->field_0x11 = uVar2;
      }
    }
    pIVar6 = (this->super_VectorView<IOVariable>).ptr;
    pIVar7 = AlignedBuffer<IOVariable,_8UL>::data(&this->stack_storage);
    if (pIVar6 != pIVar7) {
      free((this->super_VectorView<IOVariable>).ptr);
    }
    (this->super_VectorView<IOVariable>).ptr = local_58;
    this->buffer_capacity = local_20;
  }
  return;
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}